

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

void __thiscall
QDockWidgetTitleButton::paintEvent(QDockWidgetTitleButton *this,QPaintEvent *param_2)

{
  bool bVar1;
  int iVar2;
  QFlags<QStyle::StateFlag> other;
  QStyle *pQVar3;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QStylePainter p;
  QStyleOptionToolButton opt;
  undefined4 in_stack_fffffffffffffee8;
  ToolButtonFeature in_stack_fffffffffffffeec;
  QStylePainter *in_stack_fffffffffffffef0;
  QStyleOptionToolButton *this_00;
  QWidget *in_stack_fffffffffffffef8;
  QWidget *in_stack_ffffffffffffff00;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 local_a0 [8];
  QFlags<QStyle::StateFlag> aQStack_98 [14];
  undefined4 local_60;
  undefined4 local_5c;
  QSize local_48;
  undefined4 local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
  ;
  memset(local_a0,0xaa,0x98);
  QStyleOptionToolButton::QStyleOptionToolButton((QStyleOptionToolButton *)0x58a15c);
  QStyleOption::initFrom(in_RDI,in_stack_ffffffffffffff00);
  QFlags<QStyle::StateFlag>::operator|=(aQStack_98,State_AutoRaise);
  pQVar3 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x5d,0,in_RDI);
  if (iVar2 == 0) {
    bVar1 = QAbstractButton::isDown((QAbstractButton *)in_stack_fffffffffffffef0);
    if ((bVar1) ||
       (bVar1 = QAbstractButton::isChecked((QAbstractButton *)in_stack_fffffffffffffef0), bVar1)) {
      other = ::operator|((enum_type)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                          (enum_type)in_stack_fffffffffffffef0);
      QFlags<QStyle::StateFlag>::operator|=(aQStack_98,other);
    }
  }
  else {
    bVar1 = QWidget::isEnabled((QWidget *)0x58a1b9);
    if ((((bVar1) && (bVar1 = QWidget::underMouse((QWidget *)0x58a1c9), bVar1)) &&
        (bVar1 = QAbstractButton::isChecked((QAbstractButton *)in_stack_fffffffffffffef0), !bVar1))
       && (bVar1 = QAbstractButton::isDown((QAbstractButton *)in_stack_fffffffffffffef0), !bVar1)) {
      QFlags<QStyle::StateFlag>::operator|=(aQStack_98,State_Raised);
    }
    bVar1 = QAbstractButton::isChecked((QAbstractButton *)in_stack_fffffffffffffef0);
    if (bVar1) {
      QFlags<QStyle::StateFlag>::operator|=(aQStack_98,State_On);
    }
    bVar1 = QAbstractButton::isDown((QAbstractButton *)in_stack_fffffffffffffef0);
    if (bVar1) {
      QFlags<QStyle::StateFlag>::operator|=(aQStack_98,State_Sunken);
    }
    QStylePainter::drawPrimitive
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,(QStyleOption *)0x58a258);
  }
  this_00 = (QStyleOptionToolButton *)local_c0;
  QAbstractButton::icon((QAbstractButton *)in_stack_fffffffffffffef8);
  QIcon::operator=((QIcon *)in_stack_ffffffffffffff00,(QIcon *)in_stack_fffffffffffffef8);
  QIcon::~QIcon((QIcon *)this_00);
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)0x58a2e1);
  local_60 = 0;
  QFlags<QStyle::SubControl>::QFlags((QFlags<QStyle::SubControl> *)0x58a2fe);
  local_5c = 0;
  QFlags<QStyleOptionToolButton::ToolButtonFeature>::QFlags
            ((QFlags<QStyleOptionToolButton::ToolButtonFeature> *)this_00,in_stack_fffffffffffffeec)
  ;
  local_28 = 0;
  local_48 = dockButtonIconSize((QDockWidgetTitleButton *)this_00);
  QStylePainter::drawComplexControl
            ((QStylePainter *)this_00,in_stack_fffffffffffffeec,(QStyleOptionComplex *)0x58a365);
  QStyleOptionToolButton::~QStyleOptionToolButton(this_00);
  QStylePainter::~QStylePainter((QStylePainter *)0x58a379);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockWidgetTitleButton::paintEvent(QPaintEvent *)
{
    QStylePainter p(this);

    QStyleOptionToolButton opt;
    opt.initFrom(this);
    opt.state |= QStyle::State_AutoRaise;

    if (style()->styleHint(QStyle::SH_DockWidget_ButtonsHaveFrame, nullptr, this)) {
        if (isEnabled() && underMouse() && !isChecked() && !isDown())
            opt.state |= QStyle::State_Raised;
        if (isChecked())
            opt.state |= QStyle::State_On;
        if (isDown())
            opt.state |= QStyle::State_Sunken;
        p.drawPrimitive(QStyle::PE_PanelButtonTool, opt);
    } else if (isDown() || isChecked()) {
        // no frame, but the icon might have explicit pixmaps for QIcon::On
        opt.state |= QStyle::State_On | QStyle::State_Sunken;
    }

    opt.icon = icon();
    opt.subControls = { };
    opt.activeSubControls = { };
    opt.features = QStyleOptionToolButton::None;
    opt.arrowType = Qt::NoArrow;
    opt.iconSize = dockButtonIconSize();
    p.drawComplexControl(QStyle::CC_ToolButton, opt);
}